

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void YM2612_ClearBuffer(DEV_SMPL **buffer,UINT32 length)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  ulong uVar3;
  
  if (length != 0) {
    pDVar1 = *buffer;
    pDVar2 = buffer[1];
    uVar3 = 0;
    do {
      pDVar1[uVar3] = 0;
      pDVar2[uVar3] = 0;
      uVar3 = uVar3 + 1;
    } while (length != uVar3);
  }
  return;
}

Assistant:

void YM2612_ClearBuffer(DEV_SMPL **buffer, UINT32 length)
{
	// the MAME core does this before updating,
	// but the Gens core does this before mixing
	DEV_SMPL *bufL, *bufR;
	UINT32 i;
	
	bufL = buffer[0];
	bufR = buffer[1];
	
	for (i = 0; i < length; i++)
	{
		bufL[i] = 0;
		bufR[i] = 0;
	}
}